

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Read3dmChunkVersion(ON_BinaryArchive *this,int *major_version,int *minor_version)

{
  bool bVar1;
  byte local_21;
  bool rc;
  uint *puStack_20;
  uchar v;
  int *minor_version_local;
  int *major_version_local;
  ON_BinaryArchive *this_local;
  
  local_21 = 0;
  puStack_20 = (uint *)minor_version;
  minor_version_local = major_version;
  major_version_local = (int *)this;
  bVar1 = ReadChar(this,&local_21);
  if (puStack_20 != (uint *)0x0) {
    *puStack_20 = (uint)local_21 % 0x10;
  }
  if (minor_version_local != (int *)0x0) {
    *minor_version_local = (int)(uint)local_21 >> 4;
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::Read3dmChunkVersion(
  int* major_version, // major // 0 to 15
  int* minor_version // minor // 0 to 16
  )
{
  unsigned char v = 0;
  bool rc = ReadChar( &v );
  if ( minor_version) *minor_version = v%16;
  // The bit shift happens on the fly in the following
  // if statement.  It was happening twice which always
  // set the major version to 0
  //v >>= 4;
  if ( major_version) *major_version = (v>>4);
  return rc;
}